

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry-inl.h
# Opt level: O1

void __thiscall spdlog::details::registry::disable_backtrace(registry *this)

{
  int iVar1;
  __node_base *p_Var2;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar1 == 0) {
    this->backtrace_n_messages_ = 0;
    p_Var2 = &(this->loggers_)._M_h._M_before_begin;
    while (p_Var2 = p_Var2->_M_nxt, p_Var2 != (__node_base *)0x0) {
      backtracer::disable((backtracer *)(p_Var2[5]._M_nxt + 0xd));
    }
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

SPDLOG_INLINE void registry::disable_backtrace()
{
    std::lock_guard<std::mutex> lock(logger_map_mutex_);
    backtrace_n_messages_ = 0;
    for (auto &l : loggers_)
    {
        l.second->disable_backtrace();
    }
}